

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::Expression::
visitExpression<slang::ast::Expression_const,(anonymous_namespace)::EffectiveWidthVisitor&>
          (Expression *this,Expression *expr,EffectiveWidthVisitor *visitor)

{
  logic_error *this_00;
  string local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  EffectiveWidthVisitor *local_28;
  EffectiveWidthVisitor *visitor_local;
  Expression *expr_local;
  Expression *this_local;
  
  local_28 = visitor;
  visitor_local = (EffectiveWidthVisitor *)expr;
  expr_local = this;
  switch(expr->kind) {
  case Invalid:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visitInvalid(visitor,expr);
    break;
  case IntegerLiteral:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::IntegerLiteral>
                           (visitor,(IntegerLiteral *)expr);
    break;
  case RealLiteral:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::RealLiteral>
                           (visitor,(RealLiteral *)expr);
    break;
  case TimeLiteral:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::TimeLiteral>
                           (visitor,(TimeLiteral *)expr);
    break;
  case UnbasedUnsizedIntegerLiteral:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::UnbasedUnsizedIntegerLiteral>
                           (visitor,(UnbasedUnsizedIntegerLiteral *)expr);
    break;
  case NullLiteral:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::NullLiteral>
                           (visitor,(NullLiteral *)expr);
    break;
  case UnboundedLiteral:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::UnboundedLiteral>(visitor,(UnboundedLiteral *)expr);
    break;
  case StringLiteral:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::StringLiteral>
                           (visitor,(StringLiteral *)expr);
    break;
  case NamedValue:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::NamedValueExpression>(visitor,(NamedValueExpression *)expr);
    break;
  case HierarchicalValue:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::HierarchicalValueExpression>
                           (visitor,(HierarchicalValueExpression *)expr);
    break;
  case UnaryOp:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::UnaryExpression>(visitor,(UnaryExpression *)expr);
    break;
  case BinaryOp:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::BinaryExpression>(visitor,(BinaryExpression *)expr);
    break;
  case ConditionalOp:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::ConditionalExpression>(visitor,(ConditionalExpression *)expr);
    break;
  case Inside:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::InsideExpression>(visitor,(InsideExpression *)expr);
    break;
  case Assignment:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::AssignmentExpression>(visitor,(AssignmentExpression *)expr);
    break;
  case Concatenation:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::ConcatenationExpression>(visitor,(ConcatenationExpression *)expr)
    ;
    break;
  case Replication:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::ReplicationExpression>(visitor,(ReplicationExpression *)expr);
    break;
  case Streaming:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::StreamingConcatenationExpression>
                           (visitor,(StreamingConcatenationExpression *)expr);
    break;
  case ElementSelect:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::ElementSelectExpression>(visitor,(ElementSelectExpression *)expr)
    ;
    break;
  case RangeSelect:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::RangeSelectExpression>(visitor,(RangeSelectExpression *)expr);
    break;
  case MemberAccess:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::MemberAccessExpression>(visitor,(MemberAccessExpression *)expr);
    break;
  case Call:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::CallExpression>
                           (visitor,(CallExpression *)expr);
    break;
  case Conversion:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::ConversionExpression>(visitor,(ConversionExpression *)expr);
    break;
  case DataType:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::DataTypeExpression>(visitor,(DataTypeExpression *)expr);
    break;
  case TypeReference:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::TypeReferenceExpression>(visitor,(TypeReferenceExpression *)expr)
    ;
    break;
  case HierarchicalReference:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::HierarchicalReferenceExpression>
                           (visitor,(HierarchicalReferenceExpression *)expr);
    break;
  case LValueReference:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::LValueReferenceExpression>
                           (visitor,(LValueReferenceExpression *)expr);
    break;
  case SimpleAssignmentPattern:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::SimpleAssignmentPatternExpression>
                           (visitor,(SimpleAssignmentPatternExpression *)expr);
    break;
  case StructuredAssignmentPattern:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::StructuredAssignmentPatternExpression>
                           (visitor,(StructuredAssignmentPatternExpression *)expr);
    break;
  case ReplicatedAssignmentPattern:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::ReplicatedAssignmentPatternExpression>
                           (visitor,(ReplicatedAssignmentPatternExpression *)expr);
    break;
  case EmptyArgument:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::EmptyArgumentExpression>(visitor,(EmptyArgumentExpression *)expr)
    ;
    break;
  case OpenRange:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::OpenRangeExpression>(visitor,(OpenRangeExpression *)expr);
    break;
  case Dist:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::DistExpression>
                           (visitor,(DistExpression *)expr);
    break;
  case NewArray:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::NewArrayExpression>(visitor,(NewArrayExpression *)expr);
    break;
  case NewClass:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::NewClassExpression>(visitor,(NewClassExpression *)expr);
    break;
  case NewCovergroup:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::NewCovergroupExpression>(visitor,(NewCovergroupExpression *)expr)
    ;
    break;
  case CopyClass:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::CopyClassExpression>(visitor,(CopyClassExpression *)expr);
    break;
  case MinTypMax:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::MinTypMaxExpression>(visitor,(MinTypMaxExpression *)expr);
    break;
  case ClockingEvent:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::ClockingEventExpression>(visitor,(ClockingEventExpression *)expr)
    ;
    break;
  case AssertionInstance:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::AssertionInstanceExpression>
                           (visitor,(AssertionInstanceExpression *)expr);
    break;
  case TaggedUnion:
    this_local = (Expression *)
                 anon_unknown.dwarf_705d06::EffectiveWidthVisitor::
                 visit<slang::ast::TaggedUnionExpression>(visitor,(TaggedUnionExpression *)expr);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_c9);
    std::operator+(&local_a8,&local_c8,":");
    std::__cxx11::to_string(&local_100,0x15b);
    std::operator+(&local_88,&local_a8,&local_100);
    std::operator+(&local_68,&local_88,": ");
    std::operator+(&local_48,&local_68,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_48);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)this_local;
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}